

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

void __thiscall
SightCheck::P_SightOpening
          (SightCheck *this,SightOpening *open,line_t_conflict *linedef,double x,double y)

{
  sector_t_conflict *psVar1;
  sector_t_conflict *psVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  open->portalflags = 0;
  psVar1 = linedef->frontsector;
  psVar2 = linedef->backsector;
  if (psVar2 == (sector_t_conflict *)0x0) {
    uVar4 = 0;
    if ((int)linedef->flags < 0) {
      if ((psVar1->planes[1].Flags & 0x1d8U) == 0x100) {
        open->portalflags = 1;
        iVar3 = 5;
      }
      else {
        iVar3 = 4;
      }
      if ((psVar1->planes[0].Flags & 0x1d8U) == 0x100) {
        open->portalflags = iVar3;
      }
    }
    goto LAB_0044d7d6;
  }
  dVar9 = 0.0;
  dVar6 = 0.0;
  dVar8 = 0.0;
  if ((int)linedef->flags < 0) {
    dVar7 = 0.0;
    bVar5 = (psVar1->planes[1].Flags & 0x1d8U) == 0x100;
    if (bVar5) {
      open->portalflags = 1;
      dVar7 = 3.4028234663852886e+38;
    }
    uVar4 = (uint)bVar5;
    if ((psVar2->planes[1].Flags & 0x1d8U) == 0x100) {
      uVar4 = uVar4 | 2;
      open->portalflags = uVar4;
      dVar6 = 3.4028234663852886e+38;
    }
    if ((psVar1->planes[0].Flags & 0x1d8U) == 0x100) {
      uVar4 = uVar4 | 4;
      open->portalflags = uVar4;
      dVar8 = -3.4028234663852886e+38;
    }
    if ((psVar2->planes[0].Flags & 0x1d8U) == 0x100) {
      open->portalflags = uVar4 | 8;
      dVar9 = -3.4028234663852886e+38;
    }
    if ((dVar7 == 0.0) && (!NAN(dVar7))) goto LAB_0044d6a3;
  }
  else {
LAB_0044d6a3:
    dVar7 = (y * (psVar1->ceilingplane).normal.Y +
            (psVar1->ceilingplane).D + x * (psVar1->ceilingplane).normal.X) *
            (psVar1->ceilingplane).negiC;
  }
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    dVar6 = (y * (psVar2->ceilingplane).normal.Y +
            (psVar2->ceilingplane).D + x * (psVar2->ceilingplane).normal.X) *
            (psVar2->ceilingplane).negiC;
  }
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    dVar8 = (y * (psVar1->floorplane).normal.Y +
            (psVar1->floorplane).D + x * (psVar1->floorplane).normal.X) * (psVar1->floorplane).negiC
    ;
  }
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    dVar9 = (y * (psVar2->floorplane).normal.Y +
            (psVar2->floorplane).D + x * (psVar2->floorplane).normal.X) * (psVar2->floorplane).negiC
    ;
  }
  if (dVar8 <= dVar9) {
    dVar8 = dVar9;
  }
  open->bottom = dVar8;
  if (dVar6 <= dVar7) {
    dVar7 = dVar6;
  }
  open->top = dVar7;
  uVar4 = (uint)(dVar8 < dVar7);
LAB_0044d7d6:
  open->range = uVar4;
  return;
}

Assistant:

void SightCheck::P_SightOpening(SightOpening &open, const line_t *linedef, double x, double y)
{
	open.portalflags = 0;
	sector_t *front = linedef->frontsector;
	sector_t *back = linedef->backsector;

	if (back == NULL)
	{
		// single sided line
		if (linedef->flags & ML_PORTALCONNECT)
		{
			if (!front->PortalBlocksSight(sector_t::ceiling)) open.portalflags |= SO_TOPFRONT;
			if (!front->PortalBlocksSight(sector_t::floor)) open.portalflags |= SO_BOTTOMFRONT;
		}

		open.range = 0;
		return;
	}


	double fc = 0, ff = 0, bc = 0, bf = 0;

	if (linedef->flags & ML_PORTALCONNECT)
	{
		if (!front->PortalBlocksSight(sector_t::ceiling)) fc = LINEOPEN_MAX, open.portalflags |= SO_TOPFRONT;
		if (!back->PortalBlocksSight(sector_t::ceiling)) bc = LINEOPEN_MAX, open.portalflags |= SO_TOPBACK;
		if (!front->PortalBlocksSight(sector_t::floor)) ff = LINEOPEN_MIN, open.portalflags |= SO_BOTTOMFRONT;
		if (!back->PortalBlocksSight(sector_t::floor)) bf = LINEOPEN_MIN, open.portalflags |= SO_BOTTOMBACK;
	}

	if (fc == 0) fc = front->ceilingplane.ZatPoint(x, y);
	if (bc == 0) bc = back->ceilingplane.ZatPoint(x, y);
	if (ff == 0) ff = front->floorplane.ZatPoint(x, y);
	if (bf == 0) bf = back->floorplane.ZatPoint(x, y);

	open.bottom = MAX(ff, bf);
	open.top = MIN(fc, bc);

	// we only want to know if there is an opening, not how large it is.
	open.range = open.bottom < open.top;
}